

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O0

TPZFMatrix<long> * __thiscall TPZFMatrix<long>::operator+(TPZFMatrix<long> *this,long value)

{
  long *plVar1;
  int64_t iVar2;
  int64_t iVar3;
  long in_RDX;
  TPZBaseMatrix *in_RSI;
  TPZFMatrix<long> *in_RDI;
  long *dstlast;
  long *dst;
  int64_t size;
  TPZFMatrix<long> *res;
  long *local_40;
  TPZFMatrix<long> *in_stack_ffffffffffffffd8;
  uint7 in_stack_ffffffffffffffe0;
  
  TPZFMatrix((TPZFMatrix<long> *)(ulong)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  iVar2 = TPZBaseMatrix::Rows(in_RSI);
  iVar3 = TPZBaseMatrix::Cols(in_RSI);
  plVar1 = in_RDI->fElem;
  local_40 = plVar1;
  while (local_40 < plVar1 + iVar2 * iVar3) {
    *local_40 = in_RDX + *local_40;
    local_40 = local_40 + 1;
  }
  return in_RDI;
}

Assistant:

TPZFMatrix<TVar> TPZFMatrix<TVar>::operator+(const TVar value ) const {
    TPZFMatrix<TVar> res( *this );
    int64_t size = ((int64_t)this->Rows()) * this->Cols();
    
    TVar * dst = res.fElem,  *dstlast = dst+size;
    while ( dst < dstlast )
        *dst++ += value;
    
    return( res );
}